

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_CArena.cpp
# Opt level: O0

size_t __thiscall amrex::CArena::sizeOf(CArena *this,void *p)

{
  bool bVar1;
  pointer this_00;
  void *in_RSI;
  const_iterator it;
  unordered_set<amrex::CArena::Node,_amrex::CArena::Node::hash,_std::equal_to<amrex::CArena::Node>,_std::allocator<amrex::CArena::Node>_>
  *in_stack_ffffffffffffff98;
  _Node_iterator_base<amrex::CArena::Node,_false> local_40;
  Node local_38;
  _Node_iterator_base<amrex::CArena::Node,_false> local_20 [3];
  size_t local_8;
  
  if (in_RSI == (void *)0x0) {
    local_8 = 0;
  }
  else {
    Node::Node(&local_38,in_RSI,(void *)0x0,0);
    local_20[0]._M_cur =
         (__node_type *)
         std::
         unordered_set<amrex::CArena::Node,_amrex::CArena::Node::hash,_std::equal_to<amrex::CArena::Node>,_std::allocator<amrex::CArena::Node>_>
         ::find(in_stack_ffffffffffffff98,(key_type *)0xf979d6);
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_set<amrex::CArena::Node,_amrex::CArena::Node::hash,_std::equal_to<amrex::CArena::Node>,_std::allocator<amrex::CArena::Node>_>
         ::end(in_stack_ffffffffffffff98);
    bVar1 = std::__detail::operator==(local_20,&local_40);
    if (bVar1) {
      local_8 = 0;
    }
    else {
      this_00 = std::__detail::_Node_const_iterator<amrex::CArena::Node,_true,_false>::operator->
                          ((_Node_const_iterator<amrex::CArena::Node,_true,_false> *)0xf97a24);
      local_8 = Node::size(this_00);
    }
  }
  return local_8;
}

Assistant:

std::size_t
CArena::sizeOf (void* p) const noexcept
{
    if (p == nullptr) {
        return 0;
    } else {
        auto it = m_busylist.find(Node(p,0,0));
        if (it == m_busylist.end()) {
            return 0;
        } else {
            return it->size();
        }
    }
}